

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstest.c
# Opt level: O0

int main(void)

{
  int iVar1;
  bitstream *str_00;
  bitstream *nstr;
  int32_t sval;
  uint32_t val;
  bitstream *str;
  
  str._4_4_ = 0;
  _sval = vs_new_encode(VS_H264);
  nstr._4_4_ = 0xde;
  iVar1 = vs_start(_sval,(uint32_t *)((long)&nstr + 4));
  if (iVar1 == 0) {
    nstr._4_4_ = 0x123;
    iVar1 = vs_u(_sval,(uint32_t *)((long)&nstr + 4),0xc);
    if (iVar1 == 0) {
      nstr._4_4_ = 0x456;
      iVar1 = vs_u(_sval,(uint32_t *)((long)&nstr + 4),0xc);
      if (iVar1 == 0) {
        nstr._4_4_ = 8;
        iVar1 = vs_ue(_sval,(uint32_t *)((long)&nstr + 4));
        if (iVar1 == 0) {
          nstr._4_4_ = 7;
          iVar1 = vs_ue(_sval,(uint32_t *)((long)&nstr + 4));
          if (iVar1 == 0) {
            nstr._4_4_ = 6;
            iVar1 = vs_ue(_sval,(uint32_t *)((long)&nstr + 4));
            if (iVar1 == 0) {
              nstr._0_4_ = 0;
              iVar1 = vs_se(_sval,(int32_t *)&nstr);
              if (iVar1 == 0) {
                nstr._0_4_ = 0xfffffffd;
                iVar1 = vs_se(_sval,(int32_t *)&nstr);
                if (iVar1 == 0) {
                  nstr._0_4_ = 3;
                  iVar1 = vs_se(_sval,(int32_t *)&nstr);
                  if (iVar1 == 0) {
                    iVar1 = vs_end(_sval);
                    if (iVar1 == 0) {
                      fwrite(_sval->bytes,(long)_sval->bytesnum,1,_stdout);
                      str_00 = vs_new_decode(VS_H264,_sval->bytes,_sval->bytesnum);
                      iVar1 = vs_start(str_00,(uint32_t *)((long)&nstr + 4));
                      if (iVar1 == 0) {
                        if (nstr._4_4_ == 0xde) {
                          iVar1 = vs_u(str_00,(uint32_t *)((long)&nstr + 4),0xc);
                          if (iVar1 == 0) {
                            if (nstr._4_4_ == 0x123) {
                              iVar1 = vs_u(str_00,(uint32_t *)((long)&nstr + 4),0xc);
                              if (iVar1 == 0) {
                                if (nstr._4_4_ == 0x456) {
                                  iVar1 = vs_ue(str_00,(uint32_t *)((long)&nstr + 4));
                                  if (iVar1 == 0) {
                                    if (nstr._4_4_ == 8) {
                                      iVar1 = vs_ue(str_00,(uint32_t *)((long)&nstr + 4));
                                      if (iVar1 == 0) {
                                        if (nstr._4_4_ == 7) {
                                          iVar1 = vs_ue(str_00,(uint32_t *)((long)&nstr + 4));
                                          if (iVar1 == 0) {
                                            if (nstr._4_4_ == 6) {
                                              iVar1 = vs_se(str_00,(int32_t *)&nstr);
                                              if (iVar1 == 0) {
                                                if ((uint)nstr == 0) {
                                                  iVar1 = vs_se(str_00,(int32_t *)&nstr);
                                                  if (iVar1 == 0) {
                                                    if ((uint)nstr == 0xfffffffd) {
                                                      iVar1 = vs_se(str_00,(int32_t *)&nstr);
                                                      if (iVar1 == 0) {
                                                        if ((uint)nstr == 3) {
                                                          iVar1 = vs_end(str_00);
                                                          if (iVar1 == 0) {
                                                            if ((str_00->bytepos == str_00->bytesnum
                                                                ) && (str_00->hasbyte == 0)) {
                                                              fprintf(_stderr,"All ok!\n");
                                                              str._4_4_ = 0;
                                                            }
                                                            else {
                                                              fprintf(_stderr,
                                                  "Bitstream not fully consumed!\n");
                                                  str._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    str._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"Fail 9: %x\n",(ulong)(uint)nstr
                                                           );
                                                    str._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    str._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"Fail 8: %x\n",(ulong)(uint)nstr
                                                           );
                                                    str._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    str._4_4_ = 1;
                                                  }
                                                }
                                                else {
                                                  fprintf(_stderr,"Fail 7: %x\n",(ulong)(uint)nstr);
                                                  str._4_4_ = 1;
                                                }
                                              }
                                              else {
                                                str._4_4_ = 1;
                                              }
                                            }
                                            else {
                                              fprintf(_stderr,"Fail 6: %x\n",(ulong)nstr._4_4_);
                                              str._4_4_ = 1;
                                            }
                                          }
                                          else {
                                            str._4_4_ = 1;
                                          }
                                        }
                                        else {
                                          fprintf(_stderr,"Fail 5: %x\n",(ulong)nstr._4_4_);
                                          str._4_4_ = 1;
                                        }
                                      }
                                      else {
                                        str._4_4_ = 1;
                                      }
                                    }
                                    else {
                                      fprintf(_stderr,"Fail 4: %x\n",(ulong)nstr._4_4_);
                                      str._4_4_ = 1;
                                    }
                                  }
                                  else {
                                    str._4_4_ = 1;
                                  }
                                }
                                else {
                                  fprintf(_stderr,"Fail 3: %x\n",(ulong)nstr._4_4_);
                                  str._4_4_ = 1;
                                }
                              }
                              else {
                                str._4_4_ = 1;
                              }
                            }
                            else {
                              fprintf(_stderr,"Fail 2: %x\n",(ulong)nstr._4_4_);
                              str._4_4_ = 1;
                            }
                          }
                          else {
                            str._4_4_ = 1;
                          }
                        }
                        else {
                          fprintf(_stderr,"Fail 1\n");
                          str._4_4_ = 1;
                        }
                      }
                      else {
                        str._4_4_ = 1;
                      }
                    }
                    else {
                      str._4_4_ = 1;
                    }
                  }
                  else {
                    str._4_4_ = 1;
                  }
                }
                else {
                  str._4_4_ = 1;
                }
              }
              else {
                str._4_4_ = 1;
              }
            }
            else {
              str._4_4_ = 1;
            }
          }
          else {
            str._4_4_ = 1;
          }
        }
        else {
          str._4_4_ = 1;
        }
      }
      else {
        str._4_4_ = 1;
      }
    }
    else {
      str._4_4_ = 1;
    }
  }
  else {
    str._4_4_ = 1;
  }
  return str._4_4_;
}

Assistant:

int main() {
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	int32_t sval;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;
	val = 0x123;
	if (vs_u(str, &val, 12))
		return 1;
	val = 0x456;
	if (vs_u(str, &val, 12))
		return 1;
	val = 0x8;
	if (vs_ue(str, &val))
		return 1;
	val = 0x7;
	if (vs_ue(str, &val))
		return 1;
	val = 0x6;
	if (vs_ue(str, &val))
		return 1;
	sval = 0;
	if (vs_se(str, &sval))
		return 1;
	sval = -3;
	if (vs_se(str, &sval))
		return 1;
	sval = 3;
	if (vs_se(str, &sval))
		return 1;
	if (vs_end(str))
		return 1;
	fwrite(str->bytes, str->bytesnum, 1, stdout);
	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}

	if (vs_u(nstr, &val, 12))
		return 1;
	if (val != 0x123) {
		fprintf (stderr, "Fail 2: %x\n", val);
		return 1;
	}

	if (vs_u(nstr, &val, 12))
		return 1;
	if (val != 0x456) {
		fprintf (stderr, "Fail 3: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x8) {
		fprintf (stderr, "Fail 4: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x7) {
		fprintf (stderr, "Fail 5: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x6) {
		fprintf (stderr, "Fail 6: %x\n", val);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != 0) {
		fprintf (stderr, "Fail 7: %x\n", sval);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != -3) {
		fprintf (stderr, "Fail 8: %x\n", sval);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != 3) {
		fprintf (stderr, "Fail 9: %x\n", sval);
		return 1;
	}

	if (vs_end(nstr))
		return 1;
	if (nstr->bytepos != nstr->bytesnum || nstr->hasbyte) {
		fprintf (stderr, "Bitstream not fully consumed!\n");
		return 1;
	}
	fprintf (stderr, "All ok!\n");

	return 0;
}